

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersector1<8,_1,_true,_embree::avx512::ArrayIntersector1<embree::avx512::QuadMiIntersector1Pluecker<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float fVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar7;
  float **ppfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  Geometry *pGVar13;
  RTCIntersectArguments *pRVar14;
  RTCRayQueryContext *pRVar15;
  bool bVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined8 uVar19;
  ulong uVar20;
  ulong uVar21;
  undefined8 uVar22;
  uint uVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  byte bVar33;
  int iVar34;
  uint uVar35;
  long lVar36;
  ulong uVar37;
  long lVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined4 uVar71;
  undefined1 auVar72 [32];
  undefined1 auVar73 [64];
  float fVar74;
  undefined1 auVar75 [16];
  undefined8 uVar76;
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [64];
  undefined1 auVar82 [32];
  undefined1 auVar83 [64];
  undefined1 auVar84 [32];
  undefined1 auVar85 [64];
  undefined1 auVar86 [32];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [32];
  undefined1 auVar90 [64];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [64];
  undefined1 auVar94 [32];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 in_ZMM21 [64];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  int local_27dc;
  Scene *local_27d8;
  RTCFilterFunctionNArguments local_27d0;
  ulong *local_27a0;
  ulong local_2798;
  ulong local_2790;
  long local_2788;
  ulong local_2780;
  ulong local_2778;
  ulong local_2770;
  ulong local_2768;
  ulong local_2760;
  long local_2758;
  float local_2750;
  undefined4 local_274c;
  undefined4 local_2748;
  undefined4 local_2744;
  undefined4 local_2740;
  undefined4 local_273c;
  uint local_2738;
  uint local_2734;
  uint local_2730;
  undefined1 local_2720 [32];
  undefined8 local_2700;
  undefined8 uStack_26f8;
  undefined8 uStack_26f0;
  undefined8 uStack_26e8;
  undefined1 local_26e0 [32];
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined1 local_2620 [32];
  undefined1 local_2600 [32];
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [32];
  undefined1 local_25a0 [32];
  undefined8 local_2580;
  undefined8 uStack_2578;
  undefined8 uStack_2570;
  undefined8 uStack_2568;
  undefined1 local_2560 [32];
  undefined1 local_2540 [32];
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  float local_24c0;
  float fStack_24bc;
  float fStack_24b8;
  float fStack_24b4;
  float fStack_24b0;
  float fStack_24ac;
  float fStack_24a8;
  uint uStack_24a4;
  byte local_24a0;
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  float local_2420 [4];
  float fStack_2410;
  float fStack_240c;
  float fStack_2408;
  uint uStack_2404;
  float local_2400 [4];
  float fStack_23f0;
  float fStack_23ec;
  float fStack_23e8;
  uint uStack_23e4;
  float local_23e0 [4];
  float fStack_23d0;
  float fStack_23cc;
  float fStack_23c8;
  uint uStack_23c4;
  undefined1 local_23c0;
  ulong local_23a0;
  undefined4 local_2398 [2];
  ulong local_2390 [1132];
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar44 [16];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_23a0 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
    local_2398[0] = 0;
    if (local_23a0 != 8) {
      aVar7 = (ray->super_RayK<1>).dir.field_0;
      auVar17 = vmaxss_avx(ZEXT816(0) << 0x40,
                           ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
      auVar18 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
      auVar42._8_4_ = 0x7fffffff;
      auVar42._0_8_ = 0x7fffffff7fffffff;
      auVar42._12_4_ = 0x7fffffff;
      auVar42 = vandps_avx512vl((undefined1  [16])aVar7,auVar42);
      auVar43._8_4_ = 0x219392ef;
      auVar43._0_8_ = 0x219392ef219392ef;
      auVar43._12_4_ = 0x219392ef;
      uVar40 = vcmpps_avx512vl(auVar42,auVar43,1);
      local_27a0 = local_2390;
      auVar75._8_4_ = 0x3f800000;
      auVar75._0_8_ = &DAT_3f8000003f800000;
      auVar75._12_4_ = 0x3f800000;
      auVar42 = vdivps_avx(auVar75,(undefined1  [16])aVar7);
      auVar43 = vbroadcastss_avx512vl(ZEXT416(0x5d5e0b6b));
      bVar16 = (bool)((byte)uVar40 & 1);
      auVar44._0_4_ = (uint)bVar16 * auVar43._0_4_ | (uint)!bVar16 * auVar42._0_4_;
      bVar16 = (bool)((byte)(uVar40 >> 1) & 1);
      auVar44._4_4_ = (uint)bVar16 * auVar43._4_4_ | (uint)!bVar16 * auVar42._4_4_;
      bVar16 = (bool)((byte)(uVar40 >> 2) & 1);
      auVar44._8_4_ = (uint)bVar16 * auVar43._8_4_ | (uint)!bVar16 * auVar42._8_4_;
      bVar16 = (bool)((byte)(uVar40 >> 3) & 1);
      auVar44._12_4_ = (uint)bVar16 * auVar43._12_4_ | (uint)!bVar16 * auVar42._12_4_;
      auVar45._8_4_ = 0x3f7ffffa;
      auVar45._0_8_ = 0x3f7ffffa3f7ffffa;
      auVar45._12_4_ = 0x3f7ffffa;
      auVar45 = vmulps_avx512vl(auVar44,auVar45);
      auVar46._8_4_ = 0x3f800003;
      auVar46._0_8_ = 0x3f8000033f800003;
      auVar46._12_4_ = 0x3f800003;
      auVar46 = vmulps_avx512vl(auVar44,auVar46);
      uVar71 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
      local_25c0._4_4_ = uVar71;
      local_25c0._0_4_ = uVar71;
      local_25c0._8_4_ = uVar71;
      local_25c0._12_4_ = uVar71;
      local_25c0._16_4_ = uVar71;
      local_25c0._20_4_ = uVar71;
      local_25c0._24_4_ = uVar71;
      local_25c0._28_4_ = uVar71;
      auVar81 = ZEXT3264(local_25c0);
      uVar71 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
      local_25e0._4_4_ = uVar71;
      local_25e0._0_4_ = uVar71;
      local_25e0._8_4_ = uVar71;
      local_25e0._12_4_ = uVar71;
      local_25e0._16_4_ = uVar71;
      local_25e0._20_4_ = uVar71;
      local_25e0._24_4_ = uVar71;
      local_25e0._28_4_ = uVar71;
      auVar83 = ZEXT3264(local_25e0);
      uVar71 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
      local_2600._4_4_ = uVar71;
      local_2600._0_4_ = uVar71;
      local_2600._8_4_ = uVar71;
      local_2600._12_4_ = uVar71;
      local_2600._16_4_ = uVar71;
      local_2600._20_4_ = uVar71;
      local_2600._24_4_ = uVar71;
      local_2600._28_4_ = uVar71;
      auVar85 = ZEXT3264(local_2600);
      fVar74 = auVar45._0_4_;
      local_2620._4_4_ = fVar74;
      local_2620._0_4_ = fVar74;
      local_2620._8_4_ = fVar74;
      local_2620._12_4_ = fVar74;
      local_2620._16_4_ = fVar74;
      local_2620._20_4_ = fVar74;
      local_2620._24_4_ = fVar74;
      local_2620._28_4_ = fVar74;
      auVar87 = ZEXT3264(local_2620);
      auVar42 = vmovshdup_avx(auVar45);
      uVar76 = auVar42._0_8_;
      local_2640._8_8_ = uVar76;
      local_2640._0_8_ = uVar76;
      local_2640._16_8_ = uVar76;
      local_2640._24_8_ = uVar76;
      auVar88 = ZEXT3264(local_2640);
      auVar69._8_4_ = 2;
      auVar69._0_8_ = 0x200000002;
      auVar69._12_4_ = 2;
      auVar69._16_4_ = 2;
      auVar69._20_4_ = 2;
      auVar69._24_4_ = 2;
      auVar69._28_4_ = 2;
      auVar43 = vshufpd_avx(auVar45,auVar45,1);
      local_2660 = vpermps_avx2(auVar69,ZEXT1632(auVar45));
      auVar90 = ZEXT3264(local_2660);
      uVar71 = auVar46._0_4_;
      local_2680._4_4_ = uVar71;
      local_2680._0_4_ = uVar71;
      local_2680._8_4_ = uVar71;
      local_2680._12_4_ = uVar71;
      local_2680._16_4_ = uVar71;
      local_2680._20_4_ = uVar71;
      local_2680._24_4_ = uVar71;
      local_2680._28_4_ = uVar71;
      auVar93 = ZEXT3264(local_2680);
      auVar47._8_4_ = 1;
      auVar47._0_8_ = 0x100000001;
      auVar47._12_4_ = 1;
      auVar47._16_4_ = 1;
      auVar47._20_4_ = 1;
      auVar47._24_4_ = 1;
      auVar47._28_4_ = 1;
      local_26a0 = vpermps_avx2(auVar47,ZEXT1632(auVar46));
      auVar95 = ZEXT3264(local_26a0);
      local_26c0 = vpermps_avx512vl(auVar69,ZEXT1632(auVar46));
      auVar96 = ZEXT3264(local_26c0);
      uVar39 = (ulong)(fVar74 < 0.0) * 0x20;
      local_2760 = (ulong)(auVar42._0_4_ < 0.0) << 5 | 0x40;
      local_2768 = (ulong)(auVar43._0_4_ < 0.0) << 5 | 0x80;
      local_2770 = uVar39 ^ 0x20;
      local_2778 = local_2760 ^ 0x20;
      uVar40 = local_2768 ^ 0x20;
      local_2780 = uVar40;
      local_26e0 = vbroadcastss_avx512vl(auVar17);
      auVar97 = ZEXT3264(local_26e0);
      uVar71 = auVar18._0_4_;
      auVar73 = ZEXT3264(CONCAT428(uVar71,CONCAT424(uVar71,CONCAT420(uVar71,CONCAT416(uVar71,
                                                  CONCAT412(uVar71,CONCAT48(uVar71,CONCAT44(uVar71,
                                                  uVar71))))))));
      auVar47 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
      auVar98 = ZEXT3264(auVar47);
      auVar47 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
      auVar99 = ZEXT3264(auVar47);
      do {
        do {
          do {
            if (local_27a0 == &local_23a0) {
              return;
            }
            pfVar9 = (float *)(local_27a0 + -1);
            local_27a0 = local_27a0 + -2;
          } while ((ray->super_RayK<1>).tfar < *pfVar9);
          uVar41 = *local_27a0;
          do {
            auVar52 = auVar85._0_32_;
            auVar69 = auVar83._0_32_;
            auVar47 = auVar81._0_32_;
            if ((uVar41 & 8) == 0) {
              auVar53 = vsubps_avx(*(undefined1 (*) [32])(uVar41 + 0x40 + uVar39),auVar47);
              auVar48._4_4_ = auVar87._4_4_ * auVar53._4_4_;
              auVar48._0_4_ = auVar87._0_4_ * auVar53._0_4_;
              auVar48._8_4_ = auVar87._8_4_ * auVar53._8_4_;
              auVar48._12_4_ = auVar87._12_4_ * auVar53._12_4_;
              auVar48._16_4_ = auVar87._16_4_ * auVar53._16_4_;
              auVar48._20_4_ = auVar87._20_4_ * auVar53._20_4_;
              auVar48._24_4_ = auVar87._24_4_ * auVar53._24_4_;
              auVar48._28_4_ = auVar53._28_4_;
              auVar53 = vsubps_avx(*(undefined1 (*) [32])(uVar41 + 0x40 + local_2760),auVar69);
              auVar49._4_4_ = auVar88._4_4_ * auVar53._4_4_;
              auVar49._0_4_ = auVar88._0_4_ * auVar53._0_4_;
              auVar49._8_4_ = auVar88._8_4_ * auVar53._8_4_;
              auVar49._12_4_ = auVar88._12_4_ * auVar53._12_4_;
              auVar49._16_4_ = auVar88._16_4_ * auVar53._16_4_;
              auVar49._20_4_ = auVar88._20_4_ * auVar53._20_4_;
              auVar49._24_4_ = auVar88._24_4_ * auVar53._24_4_;
              auVar49._28_4_ = auVar53._28_4_;
              auVar53 = vmaxps_avx(auVar48,auVar49);
              auVar48 = vsubps_avx(*(undefined1 (*) [32])(uVar41 + 0x40 + local_2768),auVar52);
              auVar50._4_4_ = auVar90._4_4_ * auVar48._4_4_;
              auVar50._0_4_ = auVar90._0_4_ * auVar48._0_4_;
              auVar50._8_4_ = auVar90._8_4_ * auVar48._8_4_;
              auVar50._12_4_ = auVar90._12_4_ * auVar48._12_4_;
              auVar50._16_4_ = auVar90._16_4_ * auVar48._16_4_;
              auVar50._20_4_ = auVar90._20_4_ * auVar48._20_4_;
              auVar50._24_4_ = auVar90._24_4_ * auVar48._24_4_;
              auVar50._28_4_ = auVar48._28_4_;
              auVar48 = vmaxps_avx512vl(auVar50,auVar97._0_32_);
              auVar49 = vmaxps_avx512vl(auVar53,auVar48);
              in_ZMM21 = ZEXT3264(auVar49);
              auVar53 = vsubps_avx(*(undefined1 (*) [32])(uVar41 + 0x40 + local_2770),auVar47);
              auVar51._4_4_ = auVar93._4_4_ * auVar53._4_4_;
              auVar51._0_4_ = auVar93._0_4_ * auVar53._0_4_;
              auVar51._8_4_ = auVar93._8_4_ * auVar53._8_4_;
              auVar51._12_4_ = auVar93._12_4_ * auVar53._12_4_;
              auVar51._16_4_ = auVar93._16_4_ * auVar53._16_4_;
              auVar51._20_4_ = auVar93._20_4_ * auVar53._20_4_;
              auVar51._24_4_ = auVar93._24_4_ * auVar53._24_4_;
              auVar51._28_4_ = auVar53._28_4_;
              auVar53 = vsubps_avx(*(undefined1 (*) [32])(uVar41 + 0x40 + local_2778),auVar69);
              auVar54._4_4_ = auVar95._4_4_ * auVar53._4_4_;
              auVar54._0_4_ = auVar95._0_4_ * auVar53._0_4_;
              auVar54._8_4_ = auVar95._8_4_ * auVar53._8_4_;
              auVar54._12_4_ = auVar95._12_4_ * auVar53._12_4_;
              auVar54._16_4_ = auVar95._16_4_ * auVar53._16_4_;
              auVar54._20_4_ = auVar95._20_4_ * auVar53._20_4_;
              auVar54._24_4_ = auVar95._24_4_ * auVar53._24_4_;
              auVar54._28_4_ = auVar53._28_4_;
              auVar53 = vminps_avx(auVar51,auVar54);
              auVar48 = vsubps_avx(*(undefined1 (*) [32])(uVar41 + 0x40 + local_2780),auVar52);
              auVar48 = vmulps_avx512vl(auVar96._0_32_,auVar48);
              auVar48 = vminps_avx(auVar48,auVar73._0_32_);
              auVar53 = vminps_avx(auVar53,auVar48);
              uVar76 = vcmpps_avx512vl(auVar49,auVar53,2);
              uVar40 = CONCAT44((int)(uVar40 >> 0x20),(uint)(byte)uVar76);
            }
            if ((uVar41 & 8) == 0) {
              if (uVar40 == 0) {
                iVar34 = 4;
              }
              else {
                auVar53 = *(undefined1 (*) [32])(uVar41 & 0xfffffffffffffff0);
                auVar48 = ((undefined1 (*) [32])(uVar41 & 0xfffffffffffffff0))[1];
                auVar49 = vmovdqa64_avx512vl(auVar98._0_32_);
                auVar51 = in_ZMM21._0_32_;
                auVar49 = vpternlogd_avx512vl(auVar49,auVar51,auVar99._0_32_,0xf8);
                uVar41 = uVar40 & 0xffffffff;
                auVar50 = vpcompressd_avx512vl(auVar49);
                bVar16 = (bool)((byte)uVar41 & 1);
                auVar55._0_4_ = (uint)bVar16 * auVar50._0_4_ | (uint)!bVar16 * auVar49._0_4_;
                bVar16 = (bool)((byte)(uVar41 >> 1) & 1);
                auVar55._4_4_ = (uint)bVar16 * auVar50._4_4_ | (uint)!bVar16 * auVar49._4_4_;
                bVar16 = (bool)((byte)(uVar41 >> 2) & 1);
                auVar55._8_4_ = (uint)bVar16 * auVar50._8_4_ | (uint)!bVar16 * auVar49._8_4_;
                bVar16 = (bool)((byte)(uVar41 >> 3) & 1);
                auVar55._12_4_ = (uint)bVar16 * auVar50._12_4_ | (uint)!bVar16 * auVar49._12_4_;
                bVar16 = (bool)((byte)(uVar41 >> 4) & 1);
                auVar55._16_4_ = (uint)bVar16 * auVar50._16_4_ | (uint)!bVar16 * auVar49._16_4_;
                bVar16 = (bool)((byte)(uVar41 >> 5) & 1);
                auVar55._20_4_ = (uint)bVar16 * auVar50._20_4_ | (uint)!bVar16 * auVar49._20_4_;
                bVar16 = (bool)((byte)(uVar41 >> 6) & 1);
                auVar55._24_4_ = (uint)bVar16 * auVar50._24_4_ | (uint)!bVar16 * auVar49._24_4_;
                bVar16 = (bool)((byte)(uVar41 >> 7) & 1);
                auVar55._28_4_ = (uint)bVar16 * auVar50._28_4_ | (uint)!bVar16 * auVar49._28_4_;
                auVar49 = vpermt2q_avx512vl(auVar53,auVar55,auVar48);
                uVar41 = auVar49._0_8_;
                iVar34 = 0;
                uVar37 = uVar40 - 1 & uVar40;
                if (uVar37 != 0) {
                  auVar49 = vpshufd_avx2(auVar55,0x55);
                  vpermt2q_avx512vl(auVar53,auVar49,auVar48);
                  auVar50 = vpminsd_avx2(auVar55,auVar49);
                  auVar49 = vpmaxsd_avx2(auVar55,auVar49);
                  uVar37 = uVar37 - 1 & uVar37;
                  if (uVar37 == 0) {
                    auVar47 = vpermi2q_avx512vl(auVar50,auVar53,auVar48);
                    uVar41 = auVar47._0_8_;
                    auVar47 = vpermt2q_avx512vl(auVar53,auVar49,auVar48);
                    *local_27a0 = auVar47._0_8_;
                    auVar47 = vpermd_avx512vl(auVar49,auVar51);
                    *(int *)(local_27a0 + 1) = auVar47._0_4_;
                    local_27a0 = local_27a0 + 2;
                  }
                  else {
                    auVar56 = vpshufd_avx2(auVar55,0xaa);
                    vpermt2q_avx512vl(auVar53,auVar56,auVar48);
                    auVar54 = vpminsd_avx2(auVar50,auVar56);
                    auVar50 = vpmaxsd_avx2(auVar50,auVar56);
                    auVar56 = vpminsd_avx2(auVar49,auVar50);
                    auVar49 = vpmaxsd_avx2(auVar49,auVar50);
                    uVar37 = uVar37 - 1 & uVar37;
                    if (uVar37 == 0) {
                      auVar47 = vpermi2q_avx512vl(auVar54,auVar53,auVar48);
                      uVar41 = auVar47._0_8_;
                      auVar47 = vpermt2q_avx512vl(auVar53,auVar49,auVar48);
                      *local_27a0 = auVar47._0_8_;
                      auVar47 = vpermd_avx512vl(auVar49,auVar51);
                      *(int *)(local_27a0 + 1) = auVar47._0_4_;
                      auVar47 = vpermt2q_avx512vl(auVar53,auVar56,auVar48);
                      local_27a0[2] = auVar47._0_8_;
                      auVar47 = vpermd_avx512vl(auVar56,auVar51);
                      *(int *)(local_27a0 + 3) = auVar47._0_4_;
                      local_27a0 = local_27a0 + 4;
                    }
                    else {
                      auVar64 = vmovdqa64_avx512vl(auVar51);
                      auVar65 = vmovdqa64_avx512vl(auVar99._0_32_);
                      auVar66 = vmovdqa64_avx512vl(auVar98._0_32_);
                      auVar50 = vpshufd_avx2(auVar55,0xff);
                      vpermt2q_avx512vl(auVar53,auVar50,auVar48);
                      auVar51 = vpminsd_avx2(auVar54,auVar50);
                      auVar50 = vpmaxsd_avx2(auVar54,auVar50);
                      auVar54 = vpminsd_avx2(auVar56,auVar50);
                      auVar50 = vpmaxsd_avx2(auVar56,auVar50);
                      auVar56 = vpminsd_avx2(auVar49,auVar50);
                      auVar49 = vpmaxsd_avx2(auVar49,auVar50);
                      uVar37 = uVar37 - 1 & uVar37;
                      if (uVar37 == 0) {
                        auVar50 = vpermi2q_avx512vl(auVar51,auVar53,auVar48);
                        uVar41 = auVar50._0_8_;
                        auVar50 = vpermt2q_avx512vl(auVar53,auVar49,auVar48);
                        *local_27a0 = auVar50._0_8_;
                        auVar50 = vmovdqa64_avx512vl(auVar64);
                        auVar49 = vpermd_avx512vl(auVar49,auVar64);
                        *(int *)(local_27a0 + 1) = auVar49._0_4_;
                        auVar49 = vpermt2q_avx512vl(auVar53,auVar56,auVar48);
                        local_27a0[2] = auVar49._0_8_;
                        auVar49 = vpermd_avx512vl(auVar56,auVar64);
                        *(int *)(local_27a0 + 3) = auVar49._0_4_;
                        auVar53 = vpermt2q_avx512vl(auVar53,auVar54,auVar48);
                        local_27a0[4] = auVar53._0_8_;
                        auVar53 = vpermd_avx512vl(auVar54,auVar64);
                        *(int *)(local_27a0 + 5) = auVar53._0_4_;
                        local_27a0 = local_27a0 + 6;
                        auVar48 = vmovdqa64_avx512vl(auVar66);
                        auVar53 = vmovdqa64_avx512vl(auVar65);
                      }
                      else {
                        auVar55 = valignd_avx512vl(auVar55,auVar55,3);
                        auVar50 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
                        auVar51 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                                       CONCAT48(0x80000000,
                                                                                0x8000000080000000))
                                                            ),auVar50,auVar51);
                        auVar50 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                        auVar51 = vpermt2d_avx512vl(auVar51,auVar50,auVar54);
                        auVar51 = vpermt2d_avx512vl(auVar51,auVar50,auVar56);
                        auVar50 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                        auVar49 = vpermt2d_avx512vl(auVar51,auVar50,auVar49);
                        auVar81 = ZEXT3264(auVar49);
                        uVar41 = uVar37;
                        do {
                          auVar50 = auVar81._0_32_;
                          auVar57._8_4_ = 1;
                          auVar57._0_8_ = 0x100000001;
                          auVar57._12_4_ = 1;
                          auVar57._16_4_ = 1;
                          auVar57._20_4_ = 1;
                          auVar57._24_4_ = 1;
                          auVar57._28_4_ = 1;
                          auVar49 = vpermd_avx2(auVar57,auVar55);
                          auVar55 = valignd_avx512vl(auVar55,auVar55,1);
                          vpermt2q_avx512vl(auVar53,auVar55,auVar48);
                          uVar41 = uVar41 - 1 & uVar41;
                          uVar76 = vpcmpd_avx512vl(auVar49,auVar50,5);
                          auVar49 = vpmaxsd_avx2(auVar49,auVar50);
                          bVar33 = (byte)uVar76 << 1;
                          auVar50 = valignd_avx512vl(auVar50,auVar50,7);
                          bVar16 = (bool)((byte)uVar76 & 1);
                          auVar56._4_4_ =
                               (uint)bVar16 * auVar50._4_4_ | (uint)!bVar16 * auVar49._4_4_;
                          auVar56._0_4_ = auVar49._0_4_;
                          bVar16 = (bool)(bVar33 >> 2 & 1);
                          auVar56._8_4_ =
                               (uint)bVar16 * auVar50._8_4_ | (uint)!bVar16 * auVar49._8_4_;
                          bVar16 = (bool)(bVar33 >> 3 & 1);
                          auVar56._12_4_ =
                               (uint)bVar16 * auVar50._12_4_ | (uint)!bVar16 * auVar49._12_4_;
                          bVar16 = (bool)(bVar33 >> 4 & 1);
                          auVar56._16_4_ =
                               (uint)bVar16 * auVar50._16_4_ | (uint)!bVar16 * auVar49._16_4_;
                          bVar16 = (bool)(bVar33 >> 5 & 1);
                          auVar56._20_4_ =
                               (uint)bVar16 * auVar50._20_4_ | (uint)!bVar16 * auVar49._20_4_;
                          bVar16 = (bool)(bVar33 >> 6 & 1);
                          auVar56._24_4_ =
                               (uint)bVar16 * auVar50._24_4_ | (uint)!bVar16 * auVar49._24_4_;
                          auVar56._28_4_ =
                               (uint)(bVar33 >> 7) * auVar50._28_4_ |
                               (uint)!(bool)(bVar33 >> 7) * auVar49._28_4_;
                          auVar81 = ZEXT3264(auVar56);
                        } while (uVar41 != 0);
                        lVar38 = POPCOUNT(uVar37) + 3;
                        do {
                          auVar49 = vpermi2q_avx512vl(auVar56,auVar53,auVar48);
                          *local_27a0 = auVar49._0_8_;
                          auVar50 = auVar81._0_32_;
                          auVar49 = vpermd_avx512vl(auVar50,auVar64);
                          *(int *)(local_27a0 + 1) = auVar49._0_4_;
                          auVar56 = valignd_avx512vl(auVar50,auVar50,1);
                          local_27a0 = local_27a0 + 2;
                          auVar81 = ZEXT3264(auVar56);
                          lVar38 = lVar38 + -1;
                        } while (lVar38 != 0);
                        auVar53 = vpermt2q_avx512vl(auVar53,auVar56,auVar48);
                        uVar41 = auVar53._0_8_;
                        auVar48 = vmovdqa64_avx512vl(auVar66);
                        auVar53 = vmovdqa64_avx512vl(auVar65);
                        auVar50 = vmovdqa64_avx512vl(auVar64);
                      }
                      in_ZMM21 = ZEXT3264(auVar50);
                      auVar99 = ZEXT3264(auVar53);
                      auVar98 = ZEXT3264(auVar48);
                      auVar97 = ZEXT3264(auVar97._0_32_);
                      auVar96 = ZEXT3264(auVar96._0_32_);
                      auVar95 = ZEXT3264(auVar95._0_32_);
                      auVar93 = ZEXT3264(auVar93._0_32_);
                      auVar90 = ZEXT3264(auVar90._0_32_);
                      auVar88 = ZEXT3264(auVar88._0_32_);
                      auVar87 = ZEXT3264(auVar87._0_32_);
                      auVar85 = ZEXT3264(auVar52);
                      auVar83 = ZEXT3264(auVar69);
                      auVar81 = ZEXT3264(auVar47);
                      iVar34 = 0;
                    }
                  }
                }
              }
            }
            else {
              iVar34 = 6;
            }
          } while (iVar34 == 0);
        } while (iVar34 != 6);
        local_25a0 = in_ZMM21._0_32_;
        local_2788 = (ulong)((uint)uVar41 & 0xf) - 8;
        if (local_2788 != 0) {
          uVar41 = uVar41 & 0xfffffffffffffff0;
          local_27d8 = context->scene;
          local_2758 = 0;
          local_2790 = uVar40;
          local_2798 = uVar41;
          do {
            lVar36 = local_2758 * 0x60;
            ppfVar8 = (local_27d8->vertices).items;
            pfVar9 = ppfVar8[*(uint *)(uVar41 + 0x48 + lVar36)];
            auVar60._16_16_ = *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar41 + 0x28 + lVar36));
            auVar60._0_16_ = *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar41 + 8 + lVar36));
            pfVar10 = ppfVar8[*(uint *)(uVar41 + 0x40 + lVar36)];
            auVar61._16_16_ = *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar41 + 0x20 + lVar36));
            auVar61._0_16_ = *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar41 + lVar36));
            pfVar11 = ppfVar8[*(uint *)(uVar41 + 0x4c + lVar36)];
            auVar63._16_16_ = *(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar41 + 0x2c + lVar36));
            auVar63._0_16_ = *(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar41 + 0xc + lVar36));
            pfVar12 = ppfVar8[*(uint *)(uVar41 + 0x44 + lVar36)];
            auVar67._16_16_ = *(undefined1 (*) [16])(pfVar12 + *(uint *)(uVar41 + 0x24 + lVar36));
            auVar67._0_16_ = *(undefined1 (*) [16])(pfVar12 + *(uint *)(uVar41 + 4 + lVar36));
            lVar38 = uVar41 + 0x40 + lVar36;
            local_2580 = *(undefined8 *)(lVar38 + 0x10);
            uStack_2578 = *(undefined8 *)(lVar38 + 0x18);
            uStack_2570 = local_2580;
            uStack_2568 = uStack_2578;
            lVar38 = uVar41 + 0x50 + lVar36;
            local_2700 = *(undefined8 *)(lVar38 + 0x10);
            uStack_26f8 = *(undefined8 *)(lVar38 + 0x18);
            auVar18 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar10 + *(uint *)(uVar41 + 0x10 + lVar36)),
                                    *(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(uVar41 + 0x18 + lVar36)));
            auVar42 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar10 + *(uint *)(uVar41 + 0x10 + lVar36)),
                                    *(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(uVar41 + 0x18 + lVar36)));
            auVar43 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar12 + *(uint *)(uVar41 + 0x14 + lVar36)),
                                    *(undefined1 (*) [16])
                                     (pfVar11 + *(uint *)(uVar41 + 0x1c + lVar36)));
            auVar17 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar12 + *(uint *)(uVar41 + 0x14 + lVar36)),
                                    *(undefined1 (*) [16])
                                     (pfVar11 + *(uint *)(uVar41 + 0x1c + lVar36)));
            auVar45 = vunpcklps_avx(auVar42,auVar17);
            auVar46 = vunpcklps_avx(auVar18,auVar43);
            auVar42 = vunpckhps_avx(auVar18,auVar43);
            auVar43 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar10 + *(uint *)(uVar41 + 0x30 + lVar36)),
                                    *(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(uVar41 + 0x38 + lVar36)));
            auVar17 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar10 + *(uint *)(uVar41 + 0x30 + lVar36)),
                                    *(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(uVar41 + 0x38 + lVar36)));
            auVar44 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar12 + *(uint *)(uVar41 + 0x34 + lVar36)),
                                    *(undefined1 (*) [16])
                                     (pfVar11 + *(uint *)(uVar41 + 0x3c + lVar36)));
            auVar18 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar12 + *(uint *)(uVar41 + 0x34 + lVar36)),
                                    *(undefined1 (*) [16])
                                     (pfVar11 + *(uint *)(uVar41 + 0x3c + lVar36)));
            auVar18 = vunpcklps_avx(auVar17,auVar18);
            auVar75 = vunpcklps_avx(auVar43,auVar44);
            auVar17 = vunpckhps_avx(auVar43,auVar44);
            uStack_26f0 = local_2700;
            uStack_26e8 = uStack_26f8;
            auVar47 = vunpcklps_avx(auVar67,auVar63);
            auVar69 = vunpcklps_avx(auVar61,auVar60);
            auVar53 = vunpcklps_avx(auVar69,auVar47);
            auVar69 = vunpckhps_avx(auVar69,auVar47);
            auVar47 = vunpckhps_avx(auVar67,auVar63);
            auVar52 = vunpckhps_avx(auVar61,auVar60);
            auVar52 = vunpcklps_avx(auVar52,auVar47);
            auVar62._16_16_ = auVar46;
            auVar62._0_16_ = auVar46;
            auVar86._16_16_ = auVar42;
            auVar86._0_16_ = auVar42;
            auVar59._16_16_ = auVar45;
            auVar59._0_16_ = auVar45;
            auVar89._16_16_ = auVar75;
            auVar89._0_16_ = auVar75;
            auVar91._16_16_ = auVar17;
            auVar91._0_16_ = auVar17;
            uVar71 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
            auVar94._4_4_ = uVar71;
            auVar94._0_4_ = uVar71;
            auVar94._8_4_ = uVar71;
            auVar94._12_4_ = uVar71;
            auVar94._16_4_ = uVar71;
            auVar94._20_4_ = uVar71;
            auVar94._24_4_ = uVar71;
            auVar94._28_4_ = uVar71;
            auVar48 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[1]))
            ;
            auVar49 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[2]))
            ;
            uVar71 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
            auVar77._4_4_ = uVar71;
            auVar77._0_4_ = uVar71;
            auVar77._8_4_ = uVar71;
            auVar77._12_4_ = uVar71;
            auVar77._16_4_ = uVar71;
            auVar77._20_4_ = uVar71;
            auVar77._24_4_ = uVar71;
            auVar77._28_4_ = uVar71;
            auVar58._16_16_ = auVar18;
            auVar58._0_16_ = auVar18;
            uVar71 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
            auVar79._4_4_ = uVar71;
            auVar79._0_4_ = uVar71;
            auVar79._8_4_ = uVar71;
            auVar79._12_4_ = uVar71;
            auVar79._16_4_ = uVar71;
            auVar79._20_4_ = uVar71;
            auVar79._24_4_ = uVar71;
            auVar79._28_4_ = uVar71;
            fVar74 = (ray->super_RayK<1>).dir.field_0.m128[2];
            auVar82._4_4_ = fVar74;
            auVar82._0_4_ = fVar74;
            auVar82._8_4_ = fVar74;
            auVar82._12_4_ = fVar74;
            auVar82._16_4_ = fVar74;
            auVar82._20_4_ = fVar74;
            auVar82._24_4_ = fVar74;
            auVar82._28_4_ = fVar74;
            auVar47 = vsubps_avx(auVar53,auVar94);
            auVar50 = vsubps_avx512vl(auVar69,auVar48);
            auVar51 = vsubps_avx512vl(auVar52,auVar49);
            auVar52 = vsubps_avx512vl(auVar62,auVar94);
            auVar53 = vsubps_avx512vl(auVar86,auVar48);
            auVar54 = vsubps_avx512vl(auVar59,auVar49);
            auVar55 = vsubps_avx512vl(auVar89,auVar94);
            auVar48 = vsubps_avx512vl(auVar91,auVar48);
            auVar49 = vsubps_avx512vl(auVar58,auVar49);
            auVar56 = vsubps_avx512vl(auVar55,auVar47);
            auVar69 = vsubps_avx(auVar48,auVar50);
            auVar57 = vsubps_avx512vl(auVar49,auVar51);
            auVar58 = vsubps_avx512vl(auVar47,auVar52);
            auVar59 = vsubps_avx512vl(auVar50,auVar53);
            auVar60 = vsubps_avx512vl(auVar51,auVar54);
            auVar61 = vsubps_avx512vl(auVar52,auVar55);
            auVar62 = vsubps_avx512vl(auVar53,auVar48);
            auVar63 = vsubps_avx512vl(auVar54,auVar49);
            auVar64 = vaddps_avx512vl(auVar55,auVar47);
            auVar84._0_4_ = auVar48._0_4_ + auVar50._0_4_;
            auVar84._4_4_ = auVar48._4_4_ + auVar50._4_4_;
            auVar84._8_4_ = auVar48._8_4_ + auVar50._8_4_;
            auVar84._12_4_ = auVar48._12_4_ + auVar50._12_4_;
            auVar84._16_4_ = auVar48._16_4_ + auVar50._16_4_;
            auVar84._20_4_ = auVar48._20_4_ + auVar50._20_4_;
            auVar84._24_4_ = auVar48._24_4_ + auVar50._24_4_;
            auVar84._28_4_ = auVar48._28_4_ + auVar50._28_4_;
            auVar65 = vaddps_avx512vl(auVar49,auVar51);
            auVar66 = vmulps_avx512vl(auVar84,auVar57);
            auVar66 = vfmsub231ps_avx512vl(auVar66,auVar69,auVar65);
            auVar65 = vmulps_avx512vl(auVar65,auVar56);
            auVar67 = vfmsub231ps_avx512vl(auVar65,auVar57,auVar64);
            auVar65._4_4_ = auVar69._4_4_ * auVar64._4_4_;
            auVar65._0_4_ = auVar69._0_4_ * auVar64._0_4_;
            auVar65._8_4_ = auVar69._8_4_ * auVar64._8_4_;
            auVar65._12_4_ = auVar69._12_4_ * auVar64._12_4_;
            auVar65._16_4_ = auVar69._16_4_ * auVar64._16_4_;
            auVar65._20_4_ = auVar69._20_4_ * auVar64._20_4_;
            auVar65._24_4_ = auVar69._24_4_ * auVar64._24_4_;
            auVar65._28_4_ = auVar64._28_4_;
            auVar42 = vfmsub231ps_fma(auVar65,auVar56,auVar84);
            auVar68._0_4_ = fVar74 * auVar42._0_4_;
            auVar68._4_4_ = fVar74 * auVar42._4_4_;
            auVar68._8_4_ = fVar74 * auVar42._8_4_;
            auVar68._12_4_ = fVar74 * auVar42._12_4_;
            auVar68._16_4_ = fVar74 * 0.0;
            auVar68._20_4_ = fVar74 * 0.0;
            auVar68._24_4_ = fVar74 * 0.0;
            auVar68._28_4_ = 0;
            auVar64 = vfmadd231ps_avx512vl(auVar68,auVar79,auVar67);
            local_2560 = vfmadd231ps_avx512vl(auVar64,auVar77,auVar66);
            auVar64 = vaddps_avx512vl(auVar47,auVar52);
            auVar65 = vaddps_avx512vl(auVar50,auVar53);
            auVar66 = vaddps_avx512vl(auVar51,auVar54);
            auVar67 = vmulps_avx512vl(auVar65,auVar60);
            auVar67 = vfmsub231ps_avx512vl(auVar67,auVar59,auVar66);
            auVar66 = vmulps_avx512vl(auVar66,auVar58);
            auVar68 = vfmsub231ps_avx512vl(auVar66,auVar60,auVar64);
            auVar64 = vmulps_avx512vl(auVar64,auVar59);
            auVar64 = vfmsub231ps_avx512vl(auVar64,auVar58,auVar65);
            auVar66._4_4_ = fVar74 * auVar64._4_4_;
            auVar66._0_4_ = fVar74 * auVar64._0_4_;
            auVar66._8_4_ = fVar74 * auVar64._8_4_;
            auVar66._12_4_ = fVar74 * auVar64._12_4_;
            auVar66._16_4_ = fVar74 * auVar64._16_4_;
            auVar66._20_4_ = fVar74 * auVar64._20_4_;
            auVar66._24_4_ = fVar74 * auVar64._24_4_;
            auVar66._28_4_ = auVar64._28_4_;
            auVar64 = vfmadd231ps_avx512vl(auVar66,auVar79,auVar68);
            local_2540 = vfmadd231ps_avx512vl(auVar64,auVar77,auVar67);
            auVar52 = vaddps_avx512vl(auVar52,auVar55);
            auVar53 = vaddps_avx512vl(auVar53,auVar48);
            auVar48 = vaddps_avx512vl(auVar54,auVar49);
            auVar49 = vmulps_avx512vl(auVar53,auVar63);
            auVar49 = vfmsub231ps_avx512vl(auVar49,auVar62,auVar48);
            auVar48 = vmulps_avx512vl(auVar48,auVar61);
            auVar48 = vfmsub231ps_avx512vl(auVar48,auVar63,auVar52);
            auVar52 = vmulps_avx512vl(auVar52,auVar62);
            auVar52 = vfmsub231ps_avx512vl(auVar52,auVar61,auVar53);
            auVar52 = vmulps_avx512vl(auVar82,auVar52);
            auVar52 = vfmadd231ps_avx512vl(auVar52,auVar79,auVar48);
            auVar48 = vfmadd231ps_avx512vl(auVar52,auVar77,auVar49);
            auVar92._0_4_ = local_2540._0_4_ + local_2560._0_4_;
            auVar92._4_4_ = local_2540._4_4_ + local_2560._4_4_;
            auVar92._8_4_ = local_2540._8_4_ + local_2560._8_4_;
            auVar92._12_4_ = local_2540._12_4_ + local_2560._12_4_;
            auVar92._16_4_ = local_2540._16_4_ + local_2560._16_4_;
            auVar92._20_4_ = local_2540._20_4_ + local_2560._20_4_;
            auVar92._24_4_ = local_2540._24_4_ + local_2560._24_4_;
            auVar92._28_4_ = local_2540._28_4_ + local_2560._28_4_;
            local_2520 = vaddps_avx512vl(auVar48,auVar92);
            auVar52._8_4_ = 0x7fffffff;
            auVar52._0_8_ = 0x7fffffff7fffffff;
            auVar52._12_4_ = 0x7fffffff;
            auVar52._16_4_ = 0x7fffffff;
            auVar52._20_4_ = 0x7fffffff;
            auVar52._24_4_ = 0x7fffffff;
            auVar52._28_4_ = 0x7fffffff;
            vandps_avx512vl(local_2520,auVar52);
            auVar53._8_4_ = 0x34000000;
            auVar53._0_8_ = 0x3400000034000000;
            auVar53._12_4_ = 0x34000000;
            auVar53._16_4_ = 0x34000000;
            auVar53._20_4_ = 0x34000000;
            auVar53._24_4_ = 0x34000000;
            auVar53._28_4_ = 0x34000000;
            auVar52 = vmulps_avx512vl(local_2520,auVar53);
            auVar53 = vminps_avx512vl(local_2560,local_2540);
            auVar53 = vminps_avx512vl(auVar53,auVar48);
            auVar64._8_4_ = 0x80000000;
            auVar64._0_8_ = 0x8000000080000000;
            auVar64._12_4_ = 0x80000000;
            auVar64._16_4_ = 0x80000000;
            auVar64._20_4_ = 0x80000000;
            auVar64._24_4_ = 0x80000000;
            auVar64._28_4_ = 0x80000000;
            auVar49 = vxorps_avx512vl(auVar52,auVar64);
            uVar76 = vcmpps_avx512vl(auVar53,auVar49,5);
            auVar53 = vmaxps_avx512vl(local_2560,local_2540);
            auVar53 = vmaxps_avx512vl(auVar53,auVar48);
            uVar19 = vcmpps_avx512vl(auVar53,auVar52,2);
            local_24a0 = (byte)uVar76 | (byte)uVar19;
            if (local_24a0 != 0) {
              auVar52 = vmulps_avx512vl(auVar57,auVar59);
              auVar53 = vmulps_avx512vl(auVar56,auVar60);
              auVar48 = vmulps_avx512vl(auVar69,auVar58);
              auVar49 = vmulps_avx512vl(auVar60,auVar62);
              auVar54 = vmulps_avx512vl(auVar58,auVar63);
              auVar55 = vmulps_avx512vl(auVar59,auVar61);
              auVar69 = vfmsub213ps_avx512vl(auVar69,auVar60,auVar52);
              auVar64 = vfmsub213ps_avx512vl(auVar57,auVar58,auVar53);
              auVar56 = vfmsub213ps_avx512vl(auVar56,auVar59,auVar48);
              auVar65 = vfmsub213ps_avx512vl(auVar63,auVar59,auVar49);
              auVar66 = vfmsub213ps_avx512vl(auVar61,auVar60,auVar54);
              auVar57 = vfmsub213ps_avx512vl(auVar62,auVar58,auVar55);
              auVar58 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              vandps_avx512vl(auVar52,auVar58);
              vandps_avx512vl(auVar49,auVar58);
              uVar37 = vcmpps_avx512vl(auVar58,auVar58,1);
              vandps_avx512vl(auVar53,auVar58);
              vandps_avx512vl(auVar54,auVar58);
              uVar20 = vcmpps_avx512vl(auVar58,auVar58,1);
              vandps_avx512vl(auVar48,auVar58);
              vandps_avx512vl(auVar55,auVar58);
              uVar21 = vcmpps_avx512vl(auVar58,auVar58,1);
              bVar16 = (bool)((byte)uVar37 & 1);
              local_2500._0_4_ =
                   (float)((uint)bVar16 * auVar69._0_4_ | (uint)!bVar16 * auVar65._0_4_);
              bVar16 = (bool)((byte)(uVar37 >> 1) & 1);
              local_2500._4_4_ =
                   (float)((uint)bVar16 * auVar69._4_4_ | (uint)!bVar16 * auVar65._4_4_);
              bVar16 = (bool)((byte)(uVar37 >> 2) & 1);
              local_2500._8_4_ =
                   (float)((uint)bVar16 * auVar69._8_4_ | (uint)!bVar16 * auVar65._8_4_);
              bVar16 = (bool)((byte)(uVar37 >> 3) & 1);
              local_2500._12_4_ =
                   (float)((uint)bVar16 * auVar69._12_4_ | (uint)!bVar16 * auVar65._12_4_);
              bVar16 = (bool)((byte)(uVar37 >> 4) & 1);
              local_2500._16_4_ =
                   (float)((uint)bVar16 * auVar69._16_4_ | (uint)!bVar16 * auVar65._16_4_);
              bVar16 = (bool)((byte)(uVar37 >> 5) & 1);
              local_2500._20_4_ =
                   (float)((uint)bVar16 * auVar69._20_4_ | (uint)!bVar16 * auVar65._20_4_);
              bVar16 = (bool)((byte)(uVar37 >> 6) & 1);
              local_2500._24_4_ =
                   (float)((uint)bVar16 * auVar69._24_4_ | (uint)!bVar16 * auVar65._24_4_);
              bVar16 = SUB81(uVar37 >> 7,0);
              local_2500._28_4_ = (uint)bVar16 * auVar69._28_4_ | (uint)!bVar16 * auVar65._28_4_;
              bVar16 = (bool)((byte)uVar20 & 1);
              local_24e0._0_4_ =
                   (float)((uint)bVar16 * auVar64._0_4_ | (uint)!bVar16 * auVar66._0_4_);
              bVar16 = (bool)((byte)(uVar20 >> 1) & 1);
              local_24e0._4_4_ =
                   (float)((uint)bVar16 * auVar64._4_4_ | (uint)!bVar16 * auVar66._4_4_);
              bVar16 = (bool)((byte)(uVar20 >> 2) & 1);
              local_24e0._8_4_ =
                   (float)((uint)bVar16 * auVar64._8_4_ | (uint)!bVar16 * auVar66._8_4_);
              bVar16 = (bool)((byte)(uVar20 >> 3) & 1);
              local_24e0._12_4_ =
                   (float)((uint)bVar16 * auVar64._12_4_ | (uint)!bVar16 * auVar66._12_4_);
              bVar16 = (bool)((byte)(uVar20 >> 4) & 1);
              local_24e0._16_4_ =
                   (float)((uint)bVar16 * auVar64._16_4_ | (uint)!bVar16 * auVar66._16_4_);
              bVar16 = (bool)((byte)(uVar20 >> 5) & 1);
              local_24e0._20_4_ =
                   (float)((uint)bVar16 * auVar64._20_4_ | (uint)!bVar16 * auVar66._20_4_);
              bVar16 = (bool)((byte)(uVar20 >> 6) & 1);
              local_24e0._24_4_ =
                   (float)((uint)bVar16 * auVar64._24_4_ | (uint)!bVar16 * auVar66._24_4_);
              bVar16 = SUB81(uVar20 >> 7,0);
              local_24e0._28_4_ = (uint)bVar16 * auVar64._28_4_ | (uint)!bVar16 * auVar66._28_4_;
              bVar16 = (bool)((byte)uVar21 & 1);
              local_24c0 = (float)((uint)bVar16 * auVar56._0_4_ | (uint)!bVar16 * auVar57._0_4_);
              bVar16 = (bool)((byte)(uVar21 >> 1) & 1);
              fStack_24bc = (float)((uint)bVar16 * auVar56._4_4_ | (uint)!bVar16 * auVar57._4_4_);
              bVar16 = (bool)((byte)(uVar21 >> 2) & 1);
              fStack_24b8 = (float)((uint)bVar16 * auVar56._8_4_ | (uint)!bVar16 * auVar57._8_4_);
              bVar16 = (bool)((byte)(uVar21 >> 3) & 1);
              fStack_24b4 = (float)((uint)bVar16 * auVar56._12_4_ | (uint)!bVar16 * auVar57._12_4_);
              bVar16 = (bool)((byte)(uVar21 >> 4) & 1);
              fStack_24b0 = (float)((uint)bVar16 * auVar56._16_4_ | (uint)!bVar16 * auVar57._16_4_);
              bVar16 = (bool)((byte)(uVar21 >> 5) & 1);
              fStack_24ac = (float)((uint)bVar16 * auVar56._20_4_ | (uint)!bVar16 * auVar57._20_4_);
              bVar16 = (bool)((byte)(uVar21 >> 6) & 1);
              fStack_24a8 = (float)((uint)bVar16 * auVar56._24_4_ | (uint)!bVar16 * auVar57._24_4_);
              bVar16 = SUB81(uVar21 >> 7,0);
              uStack_24a4 = (uint)bVar16 * auVar56._28_4_ | (uint)!bVar16 * auVar57._28_4_;
              auVar30._4_4_ = fVar74 * fStack_24bc;
              auVar30._0_4_ = fVar74 * local_24c0;
              auVar30._8_4_ = fVar74 * fStack_24b8;
              auVar30._12_4_ = fVar74 * fStack_24b4;
              auVar30._16_4_ = fVar74 * fStack_24b0;
              auVar30._20_4_ = fVar74 * fStack_24ac;
              auVar30._24_4_ = fVar74 * fStack_24a8;
              auVar30._28_4_ = fVar74;
              auVar42 = vfmadd213ps_fma(auVar79,local_24e0,auVar30);
              auVar42 = vfmadd213ps_fma(auVar77,local_2500,ZEXT1632(auVar42));
              auVar52 = ZEXT1632(CONCAT412(auVar42._12_4_ + auVar42._12_4_,
                                           CONCAT48(auVar42._8_4_ + auVar42._8_4_,
                                                    CONCAT44(auVar42._4_4_ + auVar42._4_4_,
                                                             auVar42._0_4_ + auVar42._0_4_))));
              auVar80._0_4_ = auVar51._0_4_ * local_24c0;
              auVar80._4_4_ = auVar51._4_4_ * fStack_24bc;
              auVar80._8_4_ = auVar51._8_4_ * fStack_24b8;
              auVar80._12_4_ = auVar51._12_4_ * fStack_24b4;
              auVar80._16_4_ = auVar51._16_4_ * fStack_24b0;
              auVar80._20_4_ = auVar51._20_4_ * fStack_24ac;
              auVar80._24_4_ = auVar51._24_4_ * fStack_24a8;
              auVar80._28_4_ = 0;
              auVar42 = vfmadd213ps_fma(auVar50,local_24e0,auVar80);
              auVar17 = vfmadd213ps_fma(auVar47,local_2500,ZEXT1632(auVar42));
              auVar47 = vrcp14ps_avx512vl(auVar52);
              auVar24._8_4_ = 0x3f800000;
              auVar24._0_8_ = &DAT_3f8000003f800000;
              auVar24._12_4_ = 0x3f800000;
              auVar24._16_4_ = 0x3f800000;
              auVar24._20_4_ = 0x3f800000;
              auVar24._24_4_ = 0x3f800000;
              auVar24._28_4_ = 0x3f800000;
              auVar69 = vfnmadd213ps_avx512vl(auVar47,auVar52,auVar24);
              auVar42 = vfmadd132ps_fma(auVar69,auVar47,auVar47);
              local_2440 = ZEXT1632(CONCAT412((auVar17._12_4_ + auVar17._12_4_) * auVar42._12_4_,
                                              CONCAT48((auVar17._8_4_ + auVar17._8_4_) *
                                                       auVar42._8_4_,
                                                       CONCAT44((auVar17._4_4_ + auVar17._4_4_) *
                                                                auVar42._4_4_,
                                                                (auVar17._0_4_ + auVar17._0_4_) *
                                                                auVar42._0_4_))));
              uVar71 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
              auVar25._4_4_ = uVar71;
              auVar25._0_4_ = uVar71;
              auVar25._8_4_ = uVar71;
              auVar25._12_4_ = uVar71;
              auVar25._16_4_ = uVar71;
              auVar25._20_4_ = uVar71;
              auVar25._24_4_ = uVar71;
              auVar25._28_4_ = uVar71;
              uVar76 = vcmpps_avx512vl(local_2440,auVar25,0xd);
              auVar26._8_4_ = 0x80000000;
              auVar26._0_8_ = 0x8000000080000000;
              auVar26._12_4_ = 0x80000000;
              auVar26._16_4_ = 0x80000000;
              auVar26._20_4_ = 0x80000000;
              auVar26._24_4_ = 0x80000000;
              auVar26._28_4_ = 0x80000000;
              auVar47 = vxorps_avx512vl(auVar52,auVar26);
              fVar74 = (ray->super_RayK<1>).tfar;
              auVar27._4_4_ = fVar74;
              auVar27._0_4_ = fVar74;
              auVar27._8_4_ = fVar74;
              auVar27._12_4_ = fVar74;
              auVar27._16_4_ = fVar74;
              auVar27._20_4_ = fVar74;
              auVar27._24_4_ = fVar74;
              auVar27._28_4_ = fVar74;
              uVar19 = vcmpps_avx512vl(local_2440,auVar27,2);
              uVar22 = vcmpps_avx512vl(auVar52,auVar47,4);
              local_24a0 = (byte)uVar76 & (byte)uVar19 & (byte)uVar22 & local_24a0;
              uVar37 = (ulong)local_24a0;
              if (local_24a0 != 0) {
                local_23c0 = 0xf0;
                auVar28._8_4_ = 0x219392ef;
                auVar28._0_8_ = 0x219392ef219392ef;
                auVar28._12_4_ = 0x219392ef;
                auVar28._16_4_ = 0x219392ef;
                auVar28._20_4_ = 0x219392ef;
                auVar28._24_4_ = 0x219392ef;
                auVar28._28_4_ = 0x219392ef;
                uVar40 = vcmpps_avx512vl(local_2520,auVar28,5);
                auVar69 = vrcp14ps_avx512vl(local_2520);
                auVar78._8_4_ = 0x3f800000;
                auVar78._0_8_ = &DAT_3f8000003f800000;
                auVar78._12_4_ = 0x3f800000;
                auVar78._16_4_ = 0x3f800000;
                auVar78._20_4_ = 0x3f800000;
                auVar78._24_4_ = 0x3f800000;
                auVar78._28_4_ = 0x3f800000;
                auVar42 = vfnmadd213ps_fma(local_2520,auVar69,auVar78);
                auVar47 = vfmadd132ps_avx512vl(ZEXT1632(auVar42),auVar69,auVar69);
                fVar1 = (float)((uint)((byte)uVar40 & 1) * auVar47._0_4_);
                fVar74 = (float)((uint)((byte)(uVar40 >> 1) & 1) * auVar47._4_4_);
                fVar2 = (float)((uint)((byte)(uVar40 >> 2) & 1) * auVar47._8_4_);
                fVar3 = (float)((uint)((byte)(uVar40 >> 3) & 1) * auVar47._12_4_);
                fVar4 = (float)((uint)((byte)(uVar40 >> 4) & 1) * auVar47._16_4_);
                fVar5 = (float)((uint)((byte)(uVar40 >> 5) & 1) * auVar47._20_4_);
                fVar6 = (float)((uint)((byte)(uVar40 >> 6) & 1) * auVar47._24_4_);
                auVar31._4_4_ = fVar74 * local_2560._4_4_;
                auVar31._0_4_ = fVar1 * local_2560._0_4_;
                auVar31._8_4_ = fVar2 * local_2560._8_4_;
                auVar31._12_4_ = fVar3 * local_2560._12_4_;
                auVar31._16_4_ = fVar4 * local_2560._16_4_;
                auVar31._20_4_ = fVar5 * local_2560._20_4_;
                auVar31._24_4_ = fVar6 * local_2560._24_4_;
                auVar31._28_4_ = local_2560._28_4_;
                auVar47 = vminps_avx(auVar31,auVar78);
                auVar32._4_4_ = local_2540._4_4_ * fVar74;
                auVar32._0_4_ = local_2540._0_4_ * fVar1;
                auVar32._8_4_ = local_2540._8_4_ * fVar2;
                auVar32._12_4_ = local_2540._12_4_ * fVar3;
                auVar32._16_4_ = local_2540._16_4_ * fVar4;
                auVar32._20_4_ = local_2540._20_4_ * fVar5;
                auVar32._24_4_ = local_2540._24_4_ * fVar6;
                auVar32._28_4_ = auVar69._28_4_;
                auVar69 = vminps_avx(auVar32,auVar78);
                auVar52 = vsubps_avx(auVar78,auVar47);
                auVar53 = vsubps_avx(auVar78,auVar69);
                local_2460 = vblendps_avx(auVar69,auVar52,0xf0);
                local_2480 = vblendps_avx(auVar47,auVar53,0xf0);
                fVar74 = (float)DAT_02060940;
                fVar2 = DAT_02060940._4_4_;
                fVar3 = DAT_02060940._8_4_;
                fVar1 = DAT_02060940._12_4_;
                fVar4 = DAT_02060940._16_4_;
                fVar5 = DAT_02060940._20_4_;
                fVar6 = DAT_02060940._24_4_;
                local_2420[0] = local_2500._0_4_ * fVar74;
                local_2420[1] = local_2500._4_4_ * fVar2;
                local_2420[2] = local_2500._8_4_ * fVar3;
                local_2420[3] = local_2500._12_4_ * fVar1;
                fStack_2410 = local_2500._16_4_ * fVar4;
                fStack_240c = local_2500._20_4_ * fVar5;
                fStack_2408 = local_2500._24_4_ * fVar6;
                uStack_2404 = local_2500._28_4_;
                local_2400[0] = local_24e0._0_4_ * fVar74;
                local_2400[1] = local_24e0._4_4_ * fVar2;
                local_2400[2] = local_24e0._8_4_ * fVar3;
                local_2400[3] = local_24e0._12_4_ * fVar1;
                fStack_23f0 = local_24e0._16_4_ * fVar4;
                fStack_23ec = local_24e0._20_4_ * fVar5;
                fStack_23e8 = local_24e0._24_4_ * fVar6;
                uStack_23e4 = local_24e0._28_4_;
                local_23e0[0] = local_24c0 * fVar74;
                local_23e0[1] = fStack_24bc * fVar2;
                local_23e0[2] = fStack_24b8 * fVar3;
                local_23e0[3] = fStack_24b4 * fVar1;
                fStack_23d0 = fStack_24b0 * fVar4;
                fStack_23cc = fStack_24ac * fVar5;
                fStack_23c8 = fStack_24a8 * fVar6;
                uStack_23c4 = uStack_24a4;
                auVar72._8_4_ = 0x7f800000;
                auVar72._0_8_ = 0x7f8000007f800000;
                auVar72._12_4_ = 0x7f800000;
                auVar72._16_4_ = 0x7f800000;
                auVar72._20_4_ = 0x7f800000;
                auVar72._24_4_ = 0x7f800000;
                auVar72._28_4_ = 0x7f800000;
                auVar47 = vblendmps_avx512vl(auVar72,local_2440);
                auVar70._0_4_ =
                     (uint)(local_24a0 & 1) * auVar47._0_4_ |
                     (uint)!(bool)(local_24a0 & 1) * 0x7f800000;
                bVar16 = (bool)(local_24a0 >> 1 & 1);
                auVar70._4_4_ = (uint)bVar16 * auVar47._4_4_ | (uint)!bVar16 * 0x7f800000;
                bVar16 = (bool)(local_24a0 >> 2 & 1);
                auVar70._8_4_ = (uint)bVar16 * auVar47._8_4_ | (uint)!bVar16 * 0x7f800000;
                bVar16 = (bool)(local_24a0 >> 3 & 1);
                auVar70._12_4_ = (uint)bVar16 * auVar47._12_4_ | (uint)!bVar16 * 0x7f800000;
                bVar16 = (bool)(local_24a0 >> 4 & 1);
                auVar70._16_4_ = (uint)bVar16 * auVar47._16_4_ | (uint)!bVar16 * 0x7f800000;
                bVar16 = (bool)(local_24a0 >> 5 & 1);
                auVar70._20_4_ = (uint)bVar16 * auVar47._20_4_ | (uint)!bVar16 * 0x7f800000;
                bVar16 = (bool)(local_24a0 >> 6 & 1);
                auVar70._24_4_ = (uint)bVar16 * auVar47._24_4_ | (uint)!bVar16 * 0x7f800000;
                auVar70._28_4_ =
                     (uint)(local_24a0 >> 7) * auVar47._28_4_ |
                     (uint)!(bool)(local_24a0 >> 7) * 0x7f800000;
                auVar47 = vshufps_avx(auVar70,auVar70,0xb1);
                auVar47 = vminps_avx(auVar70,auVar47);
                auVar69 = vshufpd_avx(auVar47,auVar47,5);
                auVar47 = vminps_avx(auVar47,auVar69);
                auVar69 = vpermpd_avx2(auVar47,0x4e);
                auVar47 = vminps_avx(auVar47,auVar69);
                uVar76 = vcmpps_avx512vl(auVar70,auVar47,0);
                bVar33 = local_24a0;
                if (((byte)uVar76 & local_24a0) != 0) {
                  bVar33 = (byte)uVar76 & local_24a0;
                }
                local_2720 = local_2440;
                do {
                  uVar23 = 0;
                  for (uVar35 = (uint)bVar33; (uVar35 & 1) == 0; uVar35 = uVar35 >> 1 | 0x80000000)
                  {
                    uVar23 = uVar23 + 1;
                  }
                  uVar35 = *(uint *)((long)&local_2580 + (ulong)uVar23 * 4);
                  pGVar13 = (local_27d8->geometries).items[uVar35].ptr;
                  if ((pGVar13->mask & (ray->super_RayK<1>).mask) == 0) {
                    uVar37 = (ulong)(byte)(~(byte)(1 << (uVar23 & 0x1f)) & (byte)uVar37);
LAB_01fcaeb5:
                    bVar16 = true;
                  }
                  else {
                    pRVar14 = context->args;
                    if ((pRVar14->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar13->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      uVar40 = (ulong)(uVar23 * 4);
                      local_27d0.context = context->user;
                      local_2750 = *(float *)((long)local_2420 + uVar40);
                      local_274c = *(undefined4 *)((long)local_2400 + uVar40);
                      local_2748 = *(undefined4 *)((long)local_23e0 + uVar40);
                      local_2744 = *(undefined4 *)(local_2480 + uVar40);
                      local_2740 = *(undefined4 *)(local_2460 + uVar40);
                      local_273c = *(undefined4 *)((long)&local_2700 + uVar40);
                      local_2738 = uVar35;
                      local_2734 = (local_27d0.context)->instID[0];
                      local_2730 = (local_27d0.context)->instPrimID[0];
                      fVar74 = (ray->super_RayK<1>).tfar;
                      (ray->super_RayK<1>).tfar = *(float *)(local_2440 + uVar40);
                      local_27dc = -1;
                      local_27d0.valid = &local_27dc;
                      local_27d0.geometryUserPtr = pGVar13->userPtr;
                      local_27d0.ray = (RTCRayN *)ray;
                      local_27d0.hit = (RTCHitN *)&local_2750;
                      local_27d0.N = 1;
                      if ((pGVar13->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                         ((*pGVar13->intersectionFilterN)(&local_27d0), *local_27d0.valid != 0)) {
                        if (pRVar14->filter != (RTCFilterFunctionN)0x0) {
                          if (((pRVar14->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar13->field_8).field_0x2 & 0x40) != 0)) {
                            (*pRVar14->filter)(&local_27d0);
                          }
                          if (*local_27d0.valid == 0) goto LAB_01fcb096;
                        }
                        (((Vec3f *)((long)local_27d0.ray + 0x30))->field_0).field_0.x =
                             *(float *)local_27d0.hit;
                        (((Vec3f *)((long)local_27d0.ray + 0x30))->field_0).field_0.y =
                             *(float *)(local_27d0.hit + 4);
                        (((Vec3f *)((long)local_27d0.ray + 0x30))->field_0).field_0.z =
                             *(float *)(local_27d0.hit + 8);
                        *(float *)((long)local_27d0.ray + 0x3c) = *(float *)(local_27d0.hit + 0xc);
                        *(float *)((long)local_27d0.ray + 0x40) = *(float *)(local_27d0.hit + 0x10);
                        *(float *)((long)local_27d0.ray + 0x44) = *(float *)(local_27d0.hit + 0x14);
                        *(float *)((long)local_27d0.ray + 0x48) = *(float *)(local_27d0.hit + 0x18);
                        *(float *)((long)local_27d0.ray + 0x4c) = *(float *)(local_27d0.hit + 0x1c);
                        *(float *)((long)local_27d0.ray + 0x50) = *(float *)(local_27d0.hit + 0x20);
                      }
                      else {
LAB_01fcb096:
                        (ray->super_RayK<1>).tfar = fVar74;
                      }
                      fVar74 = (ray->super_RayK<1>).tfar;
                      auVar29._4_4_ = fVar74;
                      auVar29._0_4_ = fVar74;
                      auVar29._8_4_ = fVar74;
                      auVar29._12_4_ = fVar74;
                      auVar29._16_4_ = fVar74;
                      auVar29._20_4_ = fVar74;
                      auVar29._24_4_ = fVar74;
                      auVar29._28_4_ = fVar74;
                      uVar40 = vcmpps_avx512vl(local_2720,auVar29,2);
                      uVar37 = (byte)(~(byte)(1 << (uVar23 & 0x1f)) & (byte)uVar37) & uVar40;
                      goto LAB_01fcaeb5;
                    }
                    bVar16 = false;
                  }
                  uVar40 = local_2790;
                  uVar41 = local_2798;
                  if (!bVar16) {
                    uVar37 = (ulong)(uVar23 << 2);
                    fVar74 = *(float *)(local_2480 + uVar37);
                    fVar2 = *(float *)(local_2460 + uVar37);
                    (ray->super_RayK<1>).tfar = *(float *)(local_2440 + uVar37);
                    (ray->Ng).field_0.field_0.x = *(float *)((long)local_2420 + uVar37);
                    (ray->Ng).field_0.field_0.y = *(float *)((long)local_2400 + uVar37);
                    (ray->Ng).field_0.field_0.z = *(float *)((long)local_23e0 + uVar37);
                    ray->u = fVar74;
                    ray->v = fVar2;
                    ray->primID = *(uint *)((long)&local_2700 + uVar37);
                    ray->geomID = uVar35;
                    pRVar15 = context->user;
                    ray->instID[0] = pRVar15->instID[0];
                    ray->instPrimID[0] = pRVar15->instPrimID[0];
                    break;
                  }
                  if ((char)uVar37 == '\0') break;
                  BVHNIntersector1<8,1,true,embree::avx512::ArrayIntersector1<embree::avx512::QuadMiIntersector1Pluecker<4,true>>>
                  ::intersect();
                  bVar33 = (byte)local_27d0.valid;
                } while( true );
              }
            }
            local_2758 = local_2758 + 1;
          } while (local_2758 != local_2788);
        }
        fVar74 = (ray->super_RayK<1>).tfar;
        auVar73 = ZEXT3264(CONCAT428(fVar74,CONCAT424(fVar74,CONCAT420(fVar74,CONCAT416(fVar74,
                                                  CONCAT412(fVar74,CONCAT48(fVar74,CONCAT44(fVar74,
                                                  fVar74))))))));
        auVar81 = ZEXT3264(local_25c0);
        auVar83 = ZEXT3264(local_25e0);
        auVar85 = ZEXT3264(local_2600);
        auVar87 = ZEXT3264(local_2620);
        auVar88 = ZEXT3264(local_2640);
        auVar90 = ZEXT3264(local_2660);
        auVar93 = ZEXT3264(local_2680);
        auVar95 = ZEXT3264(local_26a0);
        auVar96 = ZEXT3264(local_26c0);
        auVar97 = ZEXT3264(local_26e0);
        auVar47 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
        auVar98 = ZEXT3264(auVar47);
        auVar47 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
        auVar99 = ZEXT3264(auVar47);
        in_ZMM21 = ZEXT3264(local_25a0);
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }